

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_PositiveIntReturnValueCanBeRetrievedAsUnsignedInt_Test::testBody
          (TEST_MockReturnValueTest_PositiveIntReturnValueCanBeRetrievedAsUnsignedInt_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  long lVar5;
  undefined4 extraout_var_00;
  TestTerminator *pTVar6;
  SimpleString local_b8;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  SimpleString local_28;
  int local_14;
  TEST_MockReturnValueTest_PositiveIntReturnValueCanBeRetrievedAsUnsignedInt_Test *pTStack_10;
  int expected_value;
  TEST_MockReturnValueTest_PositiveIntReturnValueCanBeRetrievedAsUnsignedInt_Test *this_local;
  
  local_14 = 7;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_48);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 200))
            ((long *)CONCAT44(extraout_var,iVar1),local_14);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar4 = UtestShell::getCurrent();
  lVar5 = (long)local_14;
  SimpleString::SimpleString(&local_a8,"");
  pMVar3 = mock(&local_a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_b8);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xa8))(&local_98);
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_98);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,lVar5,(ulong)uVar2,
             "LONGS_EQUAL(expected_value, mock().actualCall(\"foo\").returnValue().getUnsignedIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x47,pTVar6);
  MockNamedValue::~MockNamedValue(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  return;
}

Assistant:

TEST(MockReturnValueTest, PositiveIntReturnValueCanBeRetrievedAsUnsignedInt)
{
    int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);
    LONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedIntValue());
}